

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O2

long __thiscall
input_mod::render(input_mod *this,double volume,double delta,long samples,sample_t_conflict **buffer
                 )

{
  bool bVar1;
  int32 iVar2;
  long lVar3;
  
  iVar2 = duh_sigrenderer_generate_samples(this->sr,volume,delta,(int32)samples,buffer);
  lVar3 = (long)iVar2;
  if (lVar3 < samples) {
    if ((this->super_StreamSong).super_MusInfo.m_Looping == true) {
      duh_end_sigrenderer(this->sr);
      this->sr = (DUH_SIGRENDERER *)0x0;
      bVar1 = open2(this,0);
      if (bVar1) {
        return lVar3;
      }
    }
    this->eof = true;
  }
  return lVar3;
}

Assistant:

long input_mod::render(double volume, double delta, long samples, sample_t **buffer)
{
	long written = duh_sigrenderer_generate_samples(sr, volume, delta, samples, buffer);

	if (written < samples)
	{
		if (!m_Looping)
		{
			eof = true;
		}
		else
		{
			duh_end_sigrenderer(sr);
			sr = NULL;
			if (!open2(0))
			{
				eof = true;
			}
		}
	}
	return written;
}